

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation.cpp
# Opt level: O1

bool __thiscall CScriptCheck::operator()(CScriptCheck *this)

{
  pointer pCVar1;
  bool bVar2;
  long in_FS_OFFSET;
  BaseSignatureChecker local_58;
  CTransaction *local_50;
  undefined4 local_48;
  uint local_44;
  CAmount local_40;
  PrecomputedTransactionData *local_38;
  undefined1 local_30;
  SignatureCache *local_28;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  local_50 = this->ptxTo;
  local_44 = this->nIn;
  pCVar1 = (local_50->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
           super__Vector_impl_data._M_start;
  local_30 = this->cacheStore;
  local_28 = this->m_signature_cache;
  local_38 = this->txdata;
  local_48 = 0;
  local_40 = (this->m_tx_out).nValue;
  local_58._vptr_BaseSignatureChecker = (_func_int **)&PTR_CheckECDSASignature_00b3ad68;
  bVar2 = VerifyScript(&pCVar1[local_44].scriptSig,&(this->m_tx_out).scriptPubKey,
                       &pCVar1[local_44].scriptWitness,this->nFlags,&local_58,&this->error);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return bVar2;
  }
  __stack_chk_fail();
}

Assistant:

bool CScriptCheck::operator()() {
    const CScript &scriptSig = ptxTo->vin[nIn].scriptSig;
    const CScriptWitness *witness = &ptxTo->vin[nIn].scriptWitness;
    return VerifyScript(scriptSig, m_tx_out.scriptPubKey, witness, nFlags, CachingTransactionSignatureChecker(ptxTo, nIn, m_tx_out.nValue, cacheStore, *m_signature_cache, *txdata), &error);
}